

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_commandline_tests.cpp
# Opt level: O0

void __thiscall iu_Foo_x_iutest_x_NotRun_Test::Body(iu_Foo_x_iutest_x_NotRun_Test *this)

{
  bool bVar1;
  char *message;
  type **in_stack_fffffffffffffdd8;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_40;
  char local_3c [4];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Foo_x_iutest_x_NotRun_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  local_40 = 1;
  iutest::internal::backward::EqHelper<true>::Compare<int,int>
            ((AssertionResult *)local_38,(EqHelper<true> *)0x14a45c,"1",local_3c,&local_40,
             (int *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdd8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
               ,0x16,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(Foo, NotRun)
{
    IUTEST_ASSERT_EQ(0, 1);
}